

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpack.c
# Opt level: O0

mpack_error_t mpack_tree_destroy(mpack_tree_t *tree)

{
  mpack_tree_t *tree_local;
  
  mpack_tree_cleanup(tree);
  if (tree->buffer != (char *)0x0) {
    free(tree->buffer);
  }
  if (tree->teardown != (mpack_tree_teardown_t)0x0) {
    (*tree->teardown)(tree);
  }
  tree->teardown = (mpack_tree_teardown_t)0x0;
  return tree->error;
}

Assistant:

mpack_error_t mpack_tree_destroy(mpack_tree_t* tree) {
    mpack_tree_cleanup(tree);

    #ifdef MPACK_MALLOC
    if (tree->buffer)
        MPACK_FREE(tree->buffer);
    #endif

    if (tree->teardown)
        tree->teardown(tree);
    tree->teardown = NULL;

    return tree->error;
}